

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Release_update(int g_a,int *lo,int *hi)

{
  long lVar1;
  long lVar2;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer aIStack_98 [7];
  long lStack_60;
  Integer local_58 [8];
  
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_60)[lVar2] = (long)*lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    if (0 < lVar1) {
      do {
        aIStack_98[lVar1 + -1] = (long)*hi + 1;
        hi = hi + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
  }
  pnga_release_update((long)g_a,local_58,aIStack_98);
  return;
}

Assistant:

void NGA_Release_update(int g_a, int lo[], int hi[])
{
  Integer a = (Integer)g_a;
  Integer ndim = wnga_ndim(a);
  Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
  COPYINDEX_C2F(lo,_ga_lo,ndim);
  COPYINDEX_C2F(hi,_ga_hi,ndim);

  wnga_release_update(a,_ga_lo, _ga_hi);
}